

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O1

ArrayXd __thiscall ChebTools::ChebyshevExpansion::to_monomial_increasing(ChebyshevExpansion *this)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double *pdVar5;
  __node_base_ptr p_Var6;
  ulong uVar7;
  char *__function;
  Index index;
  ulong uVar8;
  Index extraout_RDX;
  ActualDstType actualDst;
  long lVar9;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_RSI;
  ulong uVar10;
  long lVar11;
  long lVar12;
  Index size;
  ulong uVar13;
  ArrayXd AVar14;
  ArrayXd c;
  double *local_50;
  ulong local_48;
  __buckets_ptr local_40;
  ulong local_38;
  
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&local_50,in_RSI);
  uVar7 = local_48;
  (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  if ((long)local_48 < 0) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x130,
                  "void Eigen::PlainObjectBase<Eigen::Array<double, -1, 1>>::resize(Index) [Derived = Eigen::Array<double, -1, 1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)this,local_48,local_48,1);
  uVar13 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  if ((long)uVar13 < 0) {
    __function = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Array<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Array<double, -1, 1>]"
    ;
LAB_001301f5:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x4a,__function);
  }
  pdVar4 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  if (1 < (long)uVar13) {
    memset(pdVar4,0,(uVar13 & 0x7ffffffffffffffe) * 8);
  }
  if ((long)(uVar13 & 0x7ffffffffffffffe) < (long)uVar13) {
    memset((void *)((long)pdVar4 + (uVar13 << 3 & 0xfffffffffffffff0)),0,
           (ulong)((uint)(uVar13 << 3) & 8));
  }
  if (((long)local_48 < 1) ||
     ((this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
      1)) {
    __assert_fail("index >= 0 && index < size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                  ,0x19a,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Array<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Array<double, -1, 1>, Level = 1]"
                 );
  }
  *(this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       *local_50;
  if (1 < (long)uVar7) {
    lVar9 = 2;
    uVar13 = 1;
    do {
      pdVar4 = local_50;
      if ((long)local_48 <= (long)uVar13) {
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Array<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Array<double, -1, 1>, Level = 1]"
                     );
      }
      MonomialCoefficients::get_coeffs((MonomialCoefficients *)&local_40,0x1f8a40);
      if ((long)local_38 < 0) {
        __function = 
        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Array<double, -1, 1>]"
        ;
        goto LAB_001301f5;
      }
      if ((this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows <= (long)uVar13) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                      ,0x93,
                      "Eigen::Block<Eigen::Array<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Array<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      uVar1 = uVar13 + 1;
      if (local_38 != uVar1) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/AssignEvaluator.h"
                      ,0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Block<Eigen::Array<double, -1, 1>, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>, const Eigen::Array<double, -1, 1>>, Functor = Eigen::internal::add_assign_op<double, double>]"
                     );
      }
      pdVar5 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      uVar8 = uVar1;
      if ((((ulong)pdVar5 & 7) == 0) &&
         (uVar8 = (ulong)((uint)((ulong)pdVar5 >> 3) & 1), (long)uVar1 <= (long)uVar8)) {
        uVar8 = uVar1;
      }
      dVar2 = pdVar4[uVar13];
      if (0 < (long)uVar8) {
        uVar10 = 0;
        do {
          pdVar5[uVar10] = (double)local_40[uVar10] * dVar2 + pdVar5[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
      }
      lVar12 = uVar1 - uVar8;
      lVar11 = (lVar12 - (lVar12 >> 0x3f) & 0xfffffffffffffffeU) + uVar8;
      if (1 < lVar12) {
        do {
          p_Var6 = (local_40 + uVar8)[1];
          dVar3 = (pdVar5 + uVar8)[1];
          pdVar5[uVar8] = (double)local_40[uVar8] * dVar2 + pdVar5[uVar8];
          (pdVar5 + uVar8)[1] = (double)p_Var6 * dVar2 + dVar3;
          uVar8 = uVar8 + 2;
        } while ((long)uVar8 < lVar11);
      }
      if (lVar11 <= (long)uVar13) {
        do {
          pdVar5[lVar11] = (double)local_40[lVar11] * dVar2 + pdVar5[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar9 != lVar11);
      }
      free(local_40);
      lVar9 = lVar9 + 1;
      uVar13 = uVar1;
    } while (uVar1 != uVar7);
  }
  free(local_50);
  AVar14.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  AVar14.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (ArrayXd)AVar14.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::ArrayXd ChebyshevExpansion::to_monomial_increasing() const {
        Eigen::ArrayXd c = coef();
        Eigen::Index N = c.size() - 1; // N is the degree of A
        Eigen::ArrayXd out(N+1); out.setZero();
        out[0] = c[0];
        for (auto i = 1; i <= N; ++i){
            out.head(i+1) += c(i)*get_monomial_from_Cheb_basis(i);
        }
        return out;
    }